

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::ClearDepthStencil
          (DeviceContextVkImpl *this,ITextureView *pView,CLEAR_DEPTH_STENCIL_FLAGS ClearFlags,
          float fDepth,Uint8 Stencil,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  int iVar1;
  CLEAR_DEPTH_STENCIL_FLAGS CVar2;
  TextureViewVkImpl *pTVar3;
  undefined4 extraout_var;
  Char *pCVar4;
  TextureViewVkImpl *Args_1;
  RenderPassVkImpl *pRVar5;
  StateCache *pSVar6;
  pointer pRVar7;
  VkRenderingInfoKHR *pVVar8;
  undefined4 extraout_var_00;
  TextureVkImpl *Texture;
  VkImage Image;
  bool bVar9;
  undefined1 local_114 [8];
  VkImageSubresourceRange Subresource;
  VkClearDepthStencilValue ClearValue;
  TextureVkImpl *pTextureVk;
  ITexture *pTexture;
  undefined1 local_d8 [8];
  VkClearRect ClearRect;
  VkClearAttachment ClearAttachment;
  string msg_2;
  string msg_1;
  bool ClearAsAttachment;
  undefined1 local_58 [8];
  string msg;
  TextureViewDesc *ViewDesc;
  ITextureViewVk *pVkDSV;
  RESOURCE_STATE_TRANSITION_MODE StateTransitionMode_local;
  Uint8 Stencil_local;
  float fDepth_local;
  CLEAR_DEPTH_STENCIL_FLAGS ClearFlags_local;
  ITextureView *pView_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::ClearDepthStencil
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pView);
  pTVar3 = (TextureViewVkImpl *)ClassPtrCast<Diligent::ITextureViewVk,Diligent::ITextureView>(pView)
  ;
  EnsureVkCmdBuffer(this);
  iVar1 = (**(_func_int **)
             ((long)(pTVar3->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                    .super_ObjectBase<Diligent::ITextureViewVk>.
                    super_RefCountedObject<Diligent::ITextureViewVk>.super_ITextureViewVk.
                    super_ITextureView.super_IDeviceObject + 0x20))();
  msg.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  if (*(char *)(msg.field_2._8_8_ + 9) == '\x06') {
    FormatString<char[83]>
              ((string *)local_58,
               (char (*) [83])
               "Depth-stencil view of a 3D texture should\'ve been created as 2D texture array view"
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x481);
    std::__cxx11::string::~string((string *)local_58);
  }
  Args_1 = Diligent::RefCntAutoPtr::operator_cast_to_TextureViewVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil);
  bVar9 = pTVar3 != Args_1;
  pRVar5 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if ((pRVar5 != (RenderPassVkImpl *)0x0) && (bVar9)) {
    FormatString<char[214]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [214])
               "DSV was not found in the framebuffer. This is unexpected because TDeviceContextBase::ClearDepthStencil checks if the DSV is bound as a framebuffer attachment and triggers an assert otherwise (in development mode)."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    Args_1 = (TextureViewVkImpl *)0x486;
    DebugAssertionFailed
              (pCVar4,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x486);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (bVar9) {
    EndRenderScope(this);
    iVar1 = (**(_func_int **)
               ((long)(pTVar3->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                      .super_ObjectBase<Diligent::ITextureViewVk>.
                      super_RefCountedObject<Diligent::ITextureViewVk>.super_ITextureViewVk.
                      super_ITextureView.super_IDeviceObject + 0x50))();
    Texture = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>
                        ((ITexture *)CONCAT44(extraout_var_00,iVar1));
    TransitionOrVerifyTextureState
              (this,Texture,StateTransitionMode,RESOURCE_STATE_COPY_DEST,
               VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
               "Clearing depth-stencil buffer outside of render pass (DeviceContextVkImpl::ClearDepthStencil)"
              );
    Subresource.layerCount = (uint32_t)Stencil;
    local_114._0_4_ = 0;
    Subresource.baseArrayLayer = (uint32_t)fDepth;
    CVar2 = Diligent::operator&(ClearFlags,CLEAR_DEPTH_FLAG);
    if (CVar2 != CLEAR_DEPTH_FLAG_NONE) {
      local_114._0_4_ = local_114._0_4_ | 2;
    }
    CVar2 = Diligent::operator&(ClearFlags,CLEAR_STENCIL_FLAG);
    if (CVar2 != CLEAR_DEPTH_FLAG_NONE) {
      local_114._0_4_ = local_114._0_4_ | 4;
    }
    Subresource.baseMipLevel = *(uint32_t *)(msg.field_2._8_8_ + 0x14);
    Subresource.levelCount = *(uint32_t *)(msg.field_2._8_8_ + 0x18);
    local_114._4_4_ = *(uint32_t *)(msg.field_2._8_8_ + 0xc);
    Subresource.aspectMask = *(VkImageAspectFlags *)(msg.field_2._8_8_ + 0x10);
    Image = TextureVkImpl::GetVkImage(Texture);
    VulkanUtilities::VulkanCommandBuffer::ClearDepthStencilImage
              (&this->m_CommandBuffer,Image,(VkClearDepthStencilValue *)&Subresource.baseArrayLayer,
               (VkImageSubresourceRange *)local_114);
  }
  else {
    bVar9 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_DynamicRenderingInfo);
    if ((bVar9) &&
       (pSVar6 = VulkanUtilities::VulkanCommandBuffer::GetState(&this->m_CommandBuffer),
       pSVar6->DynamicRenderingHash == 0)) {
      CVar2 = Diligent::operator&(ClearFlags,CLEAR_DEPTH_FLAG);
      if (CVar2 != CLEAR_DEPTH_FLAG_NONE) {
        pRVar7 = std::
                 unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                 ::operator->(&this->m_DynamicRenderingInfo);
        pVVar8 = VulkanUtilities::RenderingInfoWrapper::Get(pRVar7);
        if (pVVar8->pDepthAttachment != (VkRenderingAttachmentInfo *)0x0) {
          pRVar7 = std::
                   unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                   ::operator->(&this->m_DynamicRenderingInfo);
          VulkanUtilities::RenderingInfoWrapper::SetDepthAttachmentClearValue(pRVar7,fDepth);
        }
      }
      CVar2 = Diligent::operator&(ClearFlags,CLEAR_STENCIL_FLAG);
      if (CVar2 != CLEAR_DEPTH_FLAG_NONE) {
        pRVar7 = std::
                 unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                 ::operator->(&this->m_DynamicRenderingInfo);
        pVVar8 = VulkanUtilities::RenderingInfoWrapper::Get(pRVar7);
        if (pVVar8->pStencilAttachment != (VkRenderingAttachmentInfo *)0x0) {
          pRVar7 = std::
                   unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                   ::operator->(&this->m_DynamicRenderingInfo);
          VulkanUtilities::RenderingInfoWrapper::SetStencilAttachmentClearValue
                    (pRVar7,(uint)Stencil);
        }
      }
    }
    else {
      if (((this->m_vkRenderPass == (VkRenderPass)0x0) ||
          (this->m_vkFramebuffer == (VkFramebuffer)0x0)) &&
         (bVar9 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr *)&this->m_DynamicRenderingInfo), !bVar9)) {
        FormatString<char[26],char[98]>
                  ((string *)((long)&ClearAttachment.clearValue + 8),
                   (Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "(m_vkRenderPass != VK_NULL_HANDLE && m_vkFramebuffer != VK_NULL_HANDLE) || m_DynamicRenderingInfo"
                   ,(char (*) [98])Args_1);
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"ClearDepthStencil",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x498);
        std::__cxx11::string::~string((string *)((long)&ClearAttachment.clearValue + 8));
      }
      pRVar5 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                         ((RefCntAutoPtr *)
                          &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass
                         );
      if (pRVar5 == (RenderPassVkImpl *)0x0) {
        TransitionRenderTargets(this,StateTransitionMode);
        CommitRenderPassAndFramebuffer(this,false);
      }
      memset(&ClearRect.baseArrayLayer,0,0x18);
      ClearRect.baseArrayLayer = 0;
      CVar2 = Diligent::operator&(ClearFlags,CLEAR_DEPTH_FLAG);
      if (CVar2 != CLEAR_DEPTH_FLAG_NONE) {
        ClearRect.baseArrayLayer = ClearRect.baseArrayLayer | 2;
      }
      CVar2 = Diligent::operator&(ClearFlags,CLEAR_STENCIL_FLAG);
      if (CVar2 != CLEAR_DEPTH_FLAG_NONE) {
        ClearRect.baseArrayLayer = ClearRect.baseArrayLayer | 4;
      }
      ClearRect.layerCount = 0xffffffff;
      ClearAttachment.colorAttachment = (uint32_t)Stencil;
      ClearRect.rect.offset.x =
           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth;
      ClearRect.rect.offset.y =
           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight;
      local_d8._0_4_ = 0;
      local_d8._4_4_ = 0;
      ClearRect.rect.extent.width = 0;
      ClearRect.rect.extent.height = *(uint32_t *)(msg.field_2._8_8_ + 0x18);
      ClearAttachment.aspectMask = (VkImageAspectFlags)fDepth;
      VulkanUtilities::VulkanCommandBuffer::ClearAttachment
                (&this->m_CommandBuffer,(VkClearAttachment *)&ClearRect.baseArrayLayer,
                 (VkClearRect *)local_d8);
    }
  }
  (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::ClearDepthStencil(ITextureView*                  pView,
                                            CLEAR_DEPTH_STENCIL_FLAGS      ClearFlags,
                                            float                          fDepth,
                                            Uint8                          Stencil,
                                            RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    TDeviceContextBase::ClearDepthStencil(pView);

    ITextureViewVk* pVkDSV = ClassPtrCast<ITextureViewVk>(pView);

    EnsureVkCmdBuffer();

    const TextureViewDesc& ViewDesc = pVkDSV->GetDesc();
    VERIFY(ViewDesc.TextureDim != RESOURCE_DIM_TEX_3D, "Depth-stencil view of a 3D texture should've been created as 2D texture array view");

    bool ClearAsAttachment = pVkDSV == m_pBoundDepthStencil;
    VERIFY(m_pActiveRenderPass == nullptr || ClearAsAttachment,
           "DSV was not found in the framebuffer. This is unexpected because TDeviceContextBase::ClearDepthStencil "
           "checks if the DSV is bound as a framebuffer attachment and triggers an assert otherwise (in development mode).");
    if (ClearAsAttachment)
    {
        if (m_DynamicRenderingInfo && m_CommandBuffer.GetState().DynamicRenderingHash == 0)
        {
            // Dynamic render pass has not been started yet
            if ((ClearFlags & CLEAR_DEPTH_FLAG) != 0 && m_DynamicRenderingInfo->Get().pDepthAttachment != nullptr)
            {
                m_DynamicRenderingInfo->SetDepthAttachmentClearValue(fDepth);
            }

            if ((ClearFlags & CLEAR_STENCIL_FLAG) != 0 && m_DynamicRenderingInfo->Get().pStencilAttachment != nullptr)
            {
                m_DynamicRenderingInfo->SetStencilAttachmentClearValue(Stencil);
            }
        }
        else
        {
            VERIFY_EXPR((m_vkRenderPass != VK_NULL_HANDLE && m_vkFramebuffer != VK_NULL_HANDLE) || m_DynamicRenderingInfo);
            if (m_pActiveRenderPass == nullptr)
            {
                // Render pass may not be currently committed

                TransitionRenderTargets(StateTransitionMode);
                // No need to verify states again
                CommitRenderPassAndFramebuffer(false);
            }

            VkClearAttachment ClearAttachment = {};
            ClearAttachment.aspectMask        = 0;
            if (ClearFlags & CLEAR_DEPTH_FLAG) ClearAttachment.aspectMask |= VK_IMAGE_ASPECT_DEPTH_BIT;
            if (ClearFlags & CLEAR_STENCIL_FLAG) ClearAttachment.aspectMask |= VK_IMAGE_ASPECT_STENCIL_BIT;
            // colorAttachment is only meaningful if VK_IMAGE_ASPECT_COLOR_BIT is set in aspectMask
            ClearAttachment.colorAttachment                 = VK_ATTACHMENT_UNUSED;
            ClearAttachment.clearValue.depthStencil.depth   = fDepth;
            ClearAttachment.clearValue.depthStencil.stencil = Stencil;
            VkClearRect ClearRect;
            // m_FramebufferWidth, m_FramebufferHeight are scaled to the proper mip level
            ClearRect.rect = {{0, 0}, {m_FramebufferWidth, m_FramebufferHeight}};
            // The layers [baseArrayLayer, baseArrayLayer + layerCount) count from the base layer of
            // the attachment image view, so baseArrayLayer is 0, not ViewDesc.FirstArraySlice
            ClearRect.baseArrayLayer = 0;
            ClearRect.layerCount     = ViewDesc.NumArraySlices;
            // No memory barriers are needed between vkCmdClearAttachments and preceding or
            // subsequent draw or attachment clear commands in the same subpass
            m_CommandBuffer.ClearAttachment(ClearAttachment, ClearRect);
        }
    }
    else
    {
        // End render pass to clear the buffer with vkCmdClearDepthStencilImage
        EndRenderScope();

        ITexture*      pTexture   = pVkDSV->GetTexture();
        TextureVkImpl* pTextureVk = ClassPtrCast<TextureVkImpl>(pTexture);

        // Image layout must be VK_IMAGE_LAYOUT_GENERAL or VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL
        TransitionOrVerifyTextureState(*pTextureVk, StateTransitionMode, RESOURCE_STATE_COPY_DEST, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                       "Clearing depth-stencil buffer outside of render pass (DeviceContextVkImpl::ClearDepthStencil)");

        VkClearDepthStencilValue ClearValue;
        ClearValue.depth   = fDepth;
        ClearValue.stencil = Stencil;
        VkImageSubresourceRange Subresource;
        Subresource.aspectMask = 0;
        if (ClearFlags & CLEAR_DEPTH_FLAG) Subresource.aspectMask |= VK_IMAGE_ASPECT_DEPTH_BIT;
        if (ClearFlags & CLEAR_STENCIL_FLAG) Subresource.aspectMask |= VK_IMAGE_ASPECT_STENCIL_BIT;
        // We are clearing the image, not image view with vkCmdClearDepthStencilImage
        Subresource.baseArrayLayer = ViewDesc.FirstArraySlice;
        Subresource.layerCount     = ViewDesc.NumArraySlices;
        Subresource.baseMipLevel   = ViewDesc.MostDetailedMip;
        Subresource.levelCount     = ViewDesc.NumMipLevels;

        m_CommandBuffer.ClearDepthStencilImage(pTextureVk->GetVkImage(), ClearValue, Subresource);
    }

    ++m_State.NumCommands;
}